

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O2

void Aig_RManSaveOne(Aig_RMan_t *p,uint *pTruth,int nVars)

{
  Aig_Man_t *p_00;
  int iVar1;
  Bdc_Fun_t *pBVar2;
  Aig_Obj_t *pAVar3;
  Bdc_Fun_t *pBVar4;
  Aig_Obj_t *p1;
  int i;
  bool bVar5;
  
  iVar1 = Bdc_ManDecompose(p->pBidec,pTruth,(uint *)0x0,nVars,(Vec_Ptr_t *)0x0,1000);
  if (-1 < iVar1) {
    pBVar2 = Bdc_ManFunc(p->pBidec,0);
    Bdc_FuncSetCopy(pBVar2,p->pAig->pConst1);
    iVar1 = 0;
    i = 0;
    if (0 < nVars) {
      iVar1 = nVars;
      i = 0;
    }
    while( true ) {
      bVar5 = iVar1 == 0;
      iVar1 = iVar1 + -1;
      if (bVar5) break;
      pBVar2 = Bdc_ManFunc(p->pBidec,i + 1);
      pAVar3 = Aig_IthVar(p->pAig,i);
      Bdc_FuncSetCopy(pBVar2,pAVar3);
      i = i + 1;
    }
    iVar1 = Bdc_ManNodeNum(p->pBidec);
    while( true ) {
      nVars = nVars + 1;
      if (iVar1 <= nVars) break;
      pBVar2 = Bdc_ManFunc(p->pBidec,nVars);
      p_00 = p->pAig;
      pBVar4 = Bdc_FuncFanin0(pBVar2);
      pAVar3 = Bdc_FunCopyHop(pBVar4);
      pBVar4 = Bdc_FuncFanin1(pBVar2);
      p1 = Bdc_FunCopyHop(pBVar4);
      pAVar3 = Aig_And(p_00,pAVar3,p1);
      Bdc_FuncSetCopy(pBVar2,pAVar3);
    }
    pBVar2 = Bdc_ManRoot(p->pBidec);
    pAVar3 = Bdc_FunCopyHop(pBVar2);
    Aig_ObjCreateCo(p->pAig,pAVar3);
    return;
  }
  puts("Decomposition failed.");
  return;
}

Assistant:

void Aig_RManSaveOne( Aig_RMan_t * p, unsigned * pTruth, int nVars )
{
    int i, nNodes, RetValue;
    Bdc_Fun_t * pFunc;
    Aig_Obj_t * pTerm;
    // perform decomposition
    RetValue = Bdc_ManDecompose( p->pBidec, pTruth, NULL, nVars, NULL, 1000 );
    if ( RetValue < 0 )
    {
        printf( "Decomposition failed.\n" );
        return;
    }
    // convert back into HOP
    Bdc_FuncSetCopy( Bdc_ManFunc( p->pBidec, 0 ), Aig_ManConst1(p->pAig) );
    for ( i = 0; i < nVars; i++ )
        Bdc_FuncSetCopy( Bdc_ManFunc( p->pBidec, i+1 ), Aig_IthVar(p->pAig, i) );
    nNodes = Bdc_ManNodeNum(p->pBidec);
    for ( i = nVars + 1; i < nNodes; i++ )
    {
        pFunc = Bdc_ManFunc( p->pBidec, i );
        Bdc_FuncSetCopy( pFunc, Aig_And( p->pAig, 
            Bdc_FunCopyHop(Bdc_FuncFanin0(pFunc)), 
            Bdc_FunCopyHop(Bdc_FuncFanin1(pFunc)) ) );
    }
    pTerm = Bdc_FunCopyHop( Bdc_ManRoot(p->pBidec) );
    pTerm = Aig_ObjCreateCo( p->pAig, pTerm );
//    assert( pTerm->fPhase == 0 );
}